

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O1

void __thiscall
CTcTokenizer::stringize_macro_actual
          (CTcTokenizer *this,CTcTokString *expbuf,char *actual_val,size_t actual_len,
          char quote_char,int add_open_quote,int add_close_quote)

{
  wchar_t wVar1;
  wchar_t wVar2;
  int iVar3;
  wchar_t wVar4;
  byte *pbVar5;
  byte *p;
  bool bVar6;
  char local_39;
  uint local_38;
  wchar_t local_34;
  
  local_39 = quote_char;
  if (add_open_quote != 0) {
    (*expbuf->_vptr_CTcTokString[4])(expbuf,&local_39,1);
  }
  p = (byte *)actual_val;
  if (0 < (long)actual_len) {
    pbVar5 = (byte *)(actual_val + actual_len);
    local_34 = L'\0';
    local_38 = 0;
    wVar4 = L'\0';
    do {
      wVar1 = utf8_ptr::s_getch((char *)p);
      if ((uint)wVar1 < 0x80) {
        iVar3 = isspace(wVar1);
        bVar6 = iVar3 != 0;
      }
      else {
        bVar6 = false;
      }
      if ((wVar4 == L'\\') || (!bVar6)) {
        if ((wVar1 == local_39) || ((wVar1 == L'\\' && (local_38 != 0)))) {
          if (actual_val < p) {
            (*expbuf->_vptr_CTcTokString[4])(expbuf,actual_val);
          }
          (*expbuf->_vptr_CTcTokString[4])(expbuf,"\\",1);
          actual_val = (char *)p;
        }
        if (wVar4 != L'\\') {
          if (local_38 == 0) {
            if ((wVar1 == L'\'') || (local_38 = 0, wVar1 == L'\"')) {
              local_38 = 1;
              local_34 = wVar1;
            }
          }
          else {
            local_38 = (uint)(local_38 == 0 || wVar1 != local_34);
          }
        }
        p = p + (ulong)(((*p >> 5 & 1) != 0) + 1 & (uint)(*p >> 7) * 3) + 1;
      }
      else {
        if (actual_val < p) {
          (*expbuf->_vptr_CTcTokString[4])(expbuf,actual_val);
        }
        while (((actual_val = (char *)p, actual_val < pbVar5 &&
                (wVar2 = utf8_ptr::s_getch(actual_val), (uint)wVar2 < 0x80)) &&
               (iVar3 = isspace(wVar2), iVar3 != 0))) {
          p = (byte *)actual_val +
              (ulong)((((byte)*actual_val >> 5 & 1) != 0) + 1 & (uint)((byte)*actual_val >> 7) * 3)
              + 1;
        }
        p = (byte *)actual_val;
        if ((wVar4 != L'\0') && (actual_val < pbVar5)) {
          (*expbuf->_vptr_CTcTokString[4])(expbuf," ",1);
        }
      }
      wVar4 = wVar1;
    } while (p < pbVar5);
  }
  if (actual_val <= p && (long)p - (long)actual_val != 0) {
    (*expbuf->_vptr_CTcTokString[4])(expbuf,actual_val,(long)p - (long)actual_val);
  }
  if (add_close_quote != 0) {
    (*expbuf->_vptr_CTcTokString[4])(expbuf,&local_39,1);
  }
  return;
}

Assistant:

void CTcTokenizer::stringize_macro_actual(CTcTokString *expbuf,
                                          const char *actual_val,
                                          size_t actual_len, char quote_char,
                                          int add_open_quote,
                                          int add_close_quote)
{
    utf8_ptr src;
    const char *start;
    int in_inner_quote;
    wchar_t inner_quote_char;
    wchar_t prvch;
    
    /* add the open quote if desired */
    if (add_open_quote)
        expbuf->append(&quote_char, 1);

    /* remember the start of the current segment */
    start = actual_val;
    
    /* 
     *   add the characters of the actual parameter value, quoting any
     *   quotes or backslashes 
     */
    for (src.set((char *)actual_val),
         in_inner_quote = FALSE, inner_quote_char = '\0', prvch = '\0' ;
         src.getptr() < actual_val + actual_len ; )
    {
        wchar_t cur;

        /* get this character */
        cur = src.getch();

        /* compress runs of whitespace to single spaces */
        if (is_space(cur) && prvch != '\\')
        {
            /* append up to this character */
            if (src.getptr() > start)
                expbuf->append(start, src.getptr() - start);

            /* find the next non-space character */
            for ( ; src.getptr() < actual_val + actual_len ; src.inc())
            {
                if (!is_space(src.getch()))
                    break;
            }

            /* 
             *   if we're not at the start or end of the string, add a
             *   single space to replace the entire run of whitespace --
             *   don't do this at the start or end of the string, since
             *   we must remove leading and trailing whitespace
             */
            if (prvch != '\0' && src.getptr() < actual_val + actual_len)
                expbuf->append(" ", 1);

            /* note that the previous character is a space */
            prvch = cur;

            /* this is the new starting point */
            start = src.getptr();

            /* proceed - we're already at the next character */
            continue;
        }

        /* 
         *   Check to see if we need to quote this character.  Quote any
         *   quote mark matching the enclosing quotes; also quote any
         *   backslash that occurs within nested quotes within the source
         *   material, but not backslashes that occur originally outside
         *   quotes.  
         */
        if (cur == quote_char
            || (cur == '\\' && in_inner_quote))
        {
            /* append the segment up to (but not including) this character */
            if (src.getptr() > start)
                expbuf->append(start, src.getptr() - start);
            
            /* add an extra backslash */
            expbuf->append("\\", 1);

            /* remember the start of the next segment */
            start = src.getptr();
        }

        /* 
         *   if this is a quote character, and it's not itself escaped,
         *   reverse our in-quote flag 
         */
        if (prvch != '\\')
        {
            /* 
             *   If we're in an inner quote, and it's a match for the open
             *   inner quote, we're no longer in a quote.  Otherwise, if
             *   we're not in quotes and this is some kind of quote, enter
             *   the new quotes.  
             */
            if (in_inner_quote && cur == inner_quote_char)
            {
                /* we're leaving the inner quoted string */
                in_inner_quote = FALSE;
            }
            else if (!in_inner_quote && (cur == '"' || cur == '\''))
            {
                /* we're entering a new inner quoted string */
                in_inner_quote = TRUE;
                inner_quote_char = cur;
            }
        }

        /* remember this as the previous character */
        prvch = cur;

        /* move on to the next character */
        src.inc();
    }

    /* if there's anything in the final segment, append it */
    if (src.getptr() > start)
        expbuf->append(start, src.getptr() - start);

    /* add the close quote if desired */
    if (add_close_quote)
        expbuf->append(&quote_char, 1);
}